

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context_tree.c
# Opt level: O0

void av1_free_pc_tree_recursive
               (PC_TREE *pc_tree,int num_planes,int keep_best,int keep_none,
               PARTITION_SEARCH_TYPE partition_search_type)

{
  char *pcVar1;
  char cVar2;
  int in_ECX;
  int in_EDX;
  undefined4 in_ESI;
  char *in_RDI;
  char in_R8B;
  int i_5;
  int i_4;
  int i_3;
  int i_2;
  PARTITION_TYPE partition;
  int i_1;
  int i;
  int in_stack_ffffffffffffffcc;
  int iVar3;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int local_28;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar4;
  int in_stack_ffffffffffffffe4;
  int iVar5;
  undefined3 in_stack_ffffffffffffffe8;
  int keep_best_00;
  
  keep_best_00 = CONCAT13(in_R8B,in_stack_ffffffffffffffe8);
  if (in_RDI != (char *)0x0) {
    if (((in_R8B == '\x02') && (in_EDX == 0)) && (in_ECX == 0)) {
      av1_free_pmc((PICK_MODE_CONTEXT *)
                   CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                   in_stack_ffffffffffffffcc);
      in_RDI[8] = '\0';
      in_RDI[9] = '\0';
      in_RDI[10] = '\0';
      in_RDI[0xb] = '\0';
      in_RDI[0xc] = '\0';
      in_RDI[0xd] = '\0';
      in_RDI[0xe] = '\0';
      in_RDI[0xf] = '\0';
      for (iVar5 = 0; iVar5 < 2; iVar5 = iVar5 + 1) {
        av1_free_pmc((PICK_MODE_CONTEXT *)
                     CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                     in_stack_ffffffffffffffcc);
        pcVar1 = in_RDI + (long)iVar5 * 8 + 0x10;
        pcVar1[0] = '\0';
        pcVar1[1] = '\0';
        pcVar1[2] = '\0';
        pcVar1[3] = '\0';
        pcVar1[4] = '\0';
        pcVar1[5] = '\0';
        pcVar1[6] = '\0';
        pcVar1[7] = '\0';
        av1_free_pmc((PICK_MODE_CONTEXT *)
                     CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                     in_stack_ffffffffffffffcc);
        pcVar1 = in_RDI + (long)iVar5 * 8 + 0x20;
        pcVar1[0] = '\0';
        pcVar1[1] = '\0';
        pcVar1[2] = '\0';
        pcVar1[3] = '\0';
        pcVar1[4] = '\0';
        pcVar1[5] = '\0';
        pcVar1[6] = '\0';
        pcVar1[7] = '\0';
      }
      for (iVar4 = 0; iVar4 < 4; iVar4 = iVar4 + 1) {
        if (*(long *)(in_RDI + (long)iVar4 * 8 + 0xd0) != 0) {
          av1_free_pc_tree_recursive
                    ((PC_TREE *)CONCAT44(in_ESI,in_EDX),in_ECX,keep_best_00,iVar5,
                     (PARTITION_SEARCH_TYPE)((uint)iVar4 >> 0x18));
          pcVar1 = in_RDI + (long)iVar4 * 8 + 0xd0;
          pcVar1[0] = '\0';
          pcVar1[1] = '\0';
          pcVar1[2] = '\0';
          pcVar1[3] = '\0';
          pcVar1[4] = '\0';
          pcVar1[5] = '\0';
          pcVar1[6] = '\0';
          pcVar1[7] = '\0';
        }
      }
      aom_free((void *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
    }
    else {
      cVar2 = *in_RDI;
      if ((in_ECX == 0) && ((in_EDX == 0 || (cVar2 != '\0')))) {
        av1_free_pmc((PICK_MODE_CONTEXT *)
                     CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                     in_stack_ffffffffffffffcc);
        in_RDI[8] = '\0';
        in_RDI[9] = '\0';
        in_RDI[10] = '\0';
        in_RDI[0xb] = '\0';
        in_RDI[0xc] = '\0';
        in_RDI[0xd] = '\0';
        in_RDI[0xe] = '\0';
        in_RDI[0xf] = '\0';
      }
      for (local_28 = 0; local_28 < 2; local_28 = local_28 + 1) {
        if ((in_EDX == 0) || (cVar2 != '\x01')) {
          av1_free_pmc((PICK_MODE_CONTEXT *)
                       CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                       in_stack_ffffffffffffffcc);
          pcVar1 = in_RDI + (long)local_28 * 8 + 0x10;
          pcVar1[0] = '\0';
          pcVar1[1] = '\0';
          pcVar1[2] = '\0';
          pcVar1[3] = '\0';
          pcVar1[4] = '\0';
          pcVar1[5] = '\0';
          pcVar1[6] = '\0';
          pcVar1[7] = '\0';
        }
        if ((in_EDX == 0) || (cVar2 != '\x02')) {
          av1_free_pmc((PICK_MODE_CONTEXT *)
                       CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                       in_stack_ffffffffffffffcc);
          pcVar1 = in_RDI + (long)local_28 * 8 + 0x20;
          pcVar1[0] = '\0';
          pcVar1[1] = '\0';
          pcVar1[2] = '\0';
          pcVar1[3] = '\0';
          pcVar1[4] = '\0';
          pcVar1[5] = '\0';
          pcVar1[6] = '\0';
          pcVar1[7] = '\0';
        }
      }
      for (iVar5 = 0; iVar5 < 3; iVar5 = iVar5 + 1) {
        if ((in_EDX == 0) || (cVar2 != '\x04')) {
          av1_free_pmc((PICK_MODE_CONTEXT *)CONCAT44(iVar5,in_stack_ffffffffffffffd0),
                       in_stack_ffffffffffffffcc);
          pcVar1 = in_RDI + (long)iVar5 * 8 + 0x30;
          pcVar1[0] = '\0';
          pcVar1[1] = '\0';
          pcVar1[2] = '\0';
          pcVar1[3] = '\0';
          pcVar1[4] = '\0';
          pcVar1[5] = '\0';
          pcVar1[6] = '\0';
          pcVar1[7] = '\0';
        }
        if ((in_EDX == 0) || (cVar2 != '\x05')) {
          av1_free_pmc((PICK_MODE_CONTEXT *)CONCAT44(iVar5,in_stack_ffffffffffffffd0),
                       in_stack_ffffffffffffffcc);
          pcVar1 = in_RDI + (long)iVar5 * 8 + 0x48;
          pcVar1[0] = '\0';
          pcVar1[1] = '\0';
          pcVar1[2] = '\0';
          pcVar1[3] = '\0';
          pcVar1[4] = '\0';
          pcVar1[5] = '\0';
          pcVar1[6] = '\0';
          pcVar1[7] = '\0';
        }
        if ((in_EDX == 0) || (cVar2 != '\x06')) {
          av1_free_pmc((PICK_MODE_CONTEXT *)CONCAT44(iVar5,in_stack_ffffffffffffffd0),
                       in_stack_ffffffffffffffcc);
          pcVar1 = in_RDI + (long)iVar5 * 8 + 0x60;
          pcVar1[0] = '\0';
          pcVar1[1] = '\0';
          pcVar1[2] = '\0';
          pcVar1[3] = '\0';
          pcVar1[4] = '\0';
          pcVar1[5] = '\0';
          pcVar1[6] = '\0';
          pcVar1[7] = '\0';
        }
        if ((in_EDX == 0) || (cVar2 != '\a')) {
          av1_free_pmc((PICK_MODE_CONTEXT *)CONCAT44(iVar5,in_stack_ffffffffffffffd0),
                       in_stack_ffffffffffffffcc);
          pcVar1 = in_RDI + (long)iVar5 * 8 + 0x78;
          pcVar1[0] = '\0';
          pcVar1[1] = '\0';
          pcVar1[2] = '\0';
          pcVar1[3] = '\0';
          pcVar1[4] = '\0';
          pcVar1[5] = '\0';
          pcVar1[6] = '\0';
          pcVar1[7] = '\0';
        }
      }
      for (iVar4 = 0; iVar4 < 4; iVar4 = iVar4 + 1) {
        if ((in_EDX == 0) || (cVar2 != '\b')) {
          av1_free_pmc((PICK_MODE_CONTEXT *)CONCAT44(iVar5,iVar4),in_stack_ffffffffffffffcc);
          pcVar1 = in_RDI + (long)iVar4 * 8 + 0x90;
          pcVar1[0] = '\0';
          pcVar1[1] = '\0';
          pcVar1[2] = '\0';
          pcVar1[3] = '\0';
          pcVar1[4] = '\0';
          pcVar1[5] = '\0';
          pcVar1[6] = '\0';
          pcVar1[7] = '\0';
        }
        if ((in_EDX == 0) || (cVar2 != '\t')) {
          av1_free_pmc((PICK_MODE_CONTEXT *)CONCAT44(iVar5,iVar4),in_stack_ffffffffffffffcc);
          pcVar1 = in_RDI + (long)iVar4 * 8 + 0xb0;
          pcVar1[0] = '\0';
          pcVar1[1] = '\0';
          pcVar1[2] = '\0';
          pcVar1[3] = '\0';
          pcVar1[4] = '\0';
          pcVar1[5] = '\0';
          pcVar1[6] = '\0';
          pcVar1[7] = '\0';
        }
      }
      if ((in_EDX == 0) || (cVar2 != '\x03')) {
        for (iVar3 = 0; iVar3 < 4; iVar3 = iVar3 + 1) {
          if (*(long *)(in_RDI + (long)iVar3 * 8 + 0xd0) != 0) {
            av1_free_pc_tree_recursive
                      ((PC_TREE *)CONCAT44(in_ESI,in_EDX),in_ECX,keep_best_00,
                       in_stack_ffffffffffffffe4,
                       (PARTITION_SEARCH_TYPE)((uint)in_stack_ffffffffffffffe0 >> 0x18));
            pcVar1 = in_RDI + (long)iVar3 * 8 + 0xd0;
            pcVar1[0] = '\0';
            pcVar1[1] = '\0';
            pcVar1[2] = '\0';
            pcVar1[3] = '\0';
            pcVar1[4] = '\0';
            pcVar1[5] = '\0';
            pcVar1[6] = '\0';
            pcVar1[7] = '\0';
          }
        }
      }
      if ((in_EDX == 0) && (in_ECX == 0)) {
        aom_free((void *)CONCAT44(iVar5,iVar4));
      }
    }
  }
  return;
}

Assistant:

void av1_free_pc_tree_recursive(PC_TREE *pc_tree, int num_planes, int keep_best,
                                int keep_none,
                                PARTITION_SEARCH_TYPE partition_search_type) {
  if (pc_tree == NULL) return;

  // Avoid freeing of extended partitions as they are not supported when
  // partition_search_type is VAR_BASED_PARTITION.
  if (partition_search_type == VAR_BASED_PARTITION && !keep_best &&
      !keep_none) {
    FREE_PMC_NODE(pc_tree->none);

    for (int i = 0; i < 2; ++i) {
      FREE_PMC_NODE(pc_tree->horizontal[i]);
      FREE_PMC_NODE(pc_tree->vertical[i]);
    }

#if !defined(NDEBUG) && !CONFIG_REALTIME_ONLY
    for (int i = 0; i < 3; ++i) {
      assert(pc_tree->horizontala[i] == NULL);
      assert(pc_tree->horizontalb[i] == NULL);
      assert(pc_tree->verticala[i] == NULL);
      assert(pc_tree->verticalb[i] == NULL);
    }
    for (int i = 0; i < 4; ++i) {
      assert(pc_tree->horizontal4[i] == NULL);
      assert(pc_tree->vertical4[i] == NULL);
    }
#endif

    for (int i = 0; i < 4; ++i) {
      if (pc_tree->split[i] != NULL) {
        av1_free_pc_tree_recursive(pc_tree->split[i], num_planes, 0, 0,
                                   partition_search_type);
        pc_tree->split[i] = NULL;
      }
    }
    aom_free(pc_tree);
    return;
  }

  const PARTITION_TYPE partition = pc_tree->partitioning;

  if (!keep_none && (!keep_best || (partition != PARTITION_NONE)))
    FREE_PMC_NODE(pc_tree->none);

  for (int i = 0; i < 2; ++i) {
    if (!keep_best || (partition != PARTITION_HORZ))
      FREE_PMC_NODE(pc_tree->horizontal[i]);
    if (!keep_best || (partition != PARTITION_VERT))
      FREE_PMC_NODE(pc_tree->vertical[i]);
  }
#if !CONFIG_REALTIME_ONLY
  for (int i = 0; i < 3; ++i) {
    if (!keep_best || (partition != PARTITION_HORZ_A))
      FREE_PMC_NODE(pc_tree->horizontala[i]);
    if (!keep_best || (partition != PARTITION_HORZ_B))
      FREE_PMC_NODE(pc_tree->horizontalb[i]);
    if (!keep_best || (partition != PARTITION_VERT_A))
      FREE_PMC_NODE(pc_tree->verticala[i]);
    if (!keep_best || (partition != PARTITION_VERT_B))
      FREE_PMC_NODE(pc_tree->verticalb[i]);
  }
  for (int i = 0; i < 4; ++i) {
    if (!keep_best || (partition != PARTITION_HORZ_4))
      FREE_PMC_NODE(pc_tree->horizontal4[i]);
    if (!keep_best || (partition != PARTITION_VERT_4))
      FREE_PMC_NODE(pc_tree->vertical4[i]);
  }
#endif
  if (!keep_best || (partition != PARTITION_SPLIT)) {
    for (int i = 0; i < 4; ++i) {
      if (pc_tree->split[i] != NULL) {
        av1_free_pc_tree_recursive(pc_tree->split[i], num_planes, 0, 0,
                                   partition_search_type);
        pc_tree->split[i] = NULL;
      }
    }
  }

  if (!keep_best && !keep_none) aom_free(pc_tree);
}